

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecIso.c
# Opt level: O2

void Cec_ManTransformClasses(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  
  if (((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) && (p->pIso != (int *)0x0)) {
    lVar3 = 0;
    memset(p->pReprs,0,(long)p->nObjs << 2);
    memset(p->pNexts,0,(long)p->nObjs << 2);
    while( true ) {
      if (p->nObjs <= lVar3) {
        return;
      }
      pGVar2 = Gia_ManObj(p,(int)lVar3);
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      p->pReprs[lVar3] = (Gia_Rpr_t)((uint)p->pReprs[lVar3] | 0xfffffff);
      uVar1 = p->pIso[lVar3];
      if ((int)uVar1 < lVar3 && (long)(int)uVar1 != 0) {
        p->pReprs[lVar3] = (Gia_Rpr_t)((uint)p->pReprs[lVar3] & 0xf0000000 | uVar1 & 0xfffffff);
        p->pNexts[p->pIso[lVar3]] = (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    }
    return;
  }
  __assert_fail("p->pReprs && p->pNexts && p->pIso",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecIso.c"
                ,0x110,"void Cec_ManTransformClasses(Gia_Man_t *)");
}

Assistant:

void Cec_ManTransformClasses( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts && p->pIso );
    memset( p->pReprs, 0, sizeof(int) * Gia_ManObjNum(p) );
    memset( p->pNexts, 0, sizeof(int) * Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        p->pReprs[i].iRepr = GIA_VOID;
        if ( p->pIso[i] && p->pIso[i] < i )
        {
            p->pReprs[i].iRepr = p->pIso[i];
            p->pNexts[p->pIso[i]] = i;
        }
    }
}